

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,string_view name)

{
  string_view searchValue;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> tran;
  shared_handle sharedTran;
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff60;
  undefined1 *puVar2;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> local_80;
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff98;
  StringMappedVector<helics::Translator,_(reference_stability)0,_5> *in_stack_ffffffffffffffa0;
  BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*> local_48;
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  local_30;
  size_t local_10;
  char *pcStack_8;
  
  local_10 = in_RSI;
  pcStack_8 = in_RDX;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(in_stack_ffffffffffffff98);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator->(&local_30);
  searchValue._M_str = pcStack_8;
  searchValue._M_len = local_10;
  gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffffa0,searchValue);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::end(in_stack_ffffffffffffff60);
  bVar1 = gmlc::containers::
          BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*>::operator!=
                    (&local_48,&local_80);
  if (bVar1) {
    puVar2 = (undefined1 *)
             gmlc::containers::
             BlockIterator<const_helics::Translator,_32,_const_helics::Translator_*const_*>::
             operator*(&local_48);
  }
  else {
    puVar2 = invalidTran;
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x3e033b);
  return (Translator *)puVar2;
}

Assistant:

const Translator& ConnectorFederateManager::getTranslator(std::string_view name) const
{
    auto sharedTran = translators.lock_shared();
    auto tran = sharedTran->find(name);
    return (tran != sharedTran.end()) ? (*tran) : invalidTran;
}